

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O1

void sd_offset_update<dense_parameters>
               (dense_parameters *weights,features *fs,uint64_t offset,float update,
               float regularization)

{
  float fVar1;
  ulong uVar2;
  float *pfVar3;
  ulong uVar4;
  
  pfVar3 = (fs->values)._begin;
  if ((fs->values)._end != pfVar3) {
    uVar2 = 0;
    do {
      uVar4 = weights->_weight_mask & (fs->indicies)._begin[uVar2];
      fVar1 = weights->_begin[uVar4 + offset];
      weights->_begin[uVar4 + offset] = (pfVar3[uVar2] * update - fVar1 * regularization) + fVar1;
      uVar2 = uVar2 + 1;
      pfVar3 = (fs->values)._begin;
    } while (uVar2 < (ulong)((long)(fs->values)._end - (long)pfVar3 >> 2));
  }
  return;
}

Assistant:

inline size_t size() const { return _end - _begin; }